

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool readSolutionFileKeywordLineOk(string *keyword,ifstream *in_file)

{
  ulong uVar1;
  istream *in_RSI;
  string *in_RDI;
  bool bVar2;
  
  uVar1 = std::ios::eof();
  bVar2 = (uVar1 & 1) == 0;
  if (bVar2) {
    std::operator>>(in_RSI,in_RDI);
  }
  return bVar2;
}

Assistant:

bool readSolutionFileKeywordLineOk(std::string& keyword,
                                   std::ifstream& in_file) {
  if (in_file.eof()) return false;
  in_file >> keyword;
  return true;
}